

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Writer.cpp
# Opt level: O2

void __thiscall OSTEI_VRR_Writer::WriteVRR_External_(OSTEI_VRR_Writer *this,ostream *os,QAM *am)

{
  OSTEI_VRR_Algorithm_Base *pOVar1;
  RRStepType step;
  int iVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  pointer am_00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  QAMList local_108;
  undefined1 local_f0 [48];
  undefined1 local_c0 [48];
  undefined1 local_90 [48];
  undefined1 local_60 [48];
  
  pOVar1 = this->vrr_algo_;
  QAM::QAM((QAM *)local_60,am);
  step = OSTEI_VRR_Algorithm_Base::GetRRStep(pOVar1,(QAM *)local_60);
  std::__cxx11::string::~string((string *)(local_60 + 0x10));
  poVar3 = std::operator<<(os,(string *)&indent5_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"VRR_");
  RRStepTypeToStr_abi_cxx11_((string *)&local_138,step);
  poVar3 = std::operator<<(poVar3,(string *)&local_138);
  poVar3 = std::operator<<(poVar3,"_");
  poVar3 = std::operator<<(poVar3,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                  [(am->qam)._M_elems[0]]);
  poVar3 = std::operator<<(poVar3,"_");
  poVar3 = std::operator<<(poVar3,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                  [(am->qam)._M_elems[1]]);
  poVar3 = std::operator<<(poVar3,"_");
  poVar3 = std::operator<<(poVar3,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                  [(am->qam)._M_elems[2]]);
  poVar3 = std::operator<<(poVar3,"_");
  poVar3 = std::operator<<(poVar3,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                  [(am->qam)._M_elems[3]]);
  std::operator<<(poVar3,"(\n");
  std::__cxx11::string::~string((string *)&local_138);
  poVar3 = std::operator<<(os,(string *)&indent7_abi_cxx11_);
  PrimVarName_abi_cxx11_((string *)&local_138,am);
  poVar3 = std::operator<<(poVar3,(string *)&local_138);
  std::operator<<(poVar3,",\n");
  std::__cxx11::string::~string((string *)&local_138);
  pOVar1 = this->vrr_algo_;
  QAM::QAM((QAM *)local_90,am);
  OSTEI_VRR_Algorithm_Base::GetAMReq(&local_108,pOVar1,(QAM *)local_90);
  std::__cxx11::string::~string((string *)(local_90 + 0x10));
  for (am_00 = local_108.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
               super__Vector_impl_data._M_start;
      am_00 != local_108.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
               super__Vector_impl_data._M_finish; am_00 = am_00 + 1) {
    poVar3 = std::operator<<(os,(string *)&indent7_abi_cxx11_);
    PrimVarName_abi_cxx11_((string *)&local_138,am_00);
    poVar3 = std::operator<<(poVar3,(string *)&local_138);
    std::operator<<(poVar3,",\n");
    std::__cxx11::string::~string((string *)&local_138);
  }
  std::vector<QAM,_std::allocator<QAM>_>::~vector(&local_108);
  pOVar1 = this->vrr_algo_;
  QAM::QAM((QAM *)local_c0,am);
  OSTEI_VRR_Algorithm_Base::GetVarReq_abi_cxx11_((StringSet *)&local_138,pOVar1,(QAM *)local_c0);
  std::__cxx11::string::~string((string *)(local_c0 + 0x10));
  for (p_Var4 = local_138._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &local_138._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    poVar3 = std::operator<<(os,(string *)&indent7_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)(p_Var4 + 1));
    std::operator<<(poVar3,",\n");
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_138);
  poVar3 = std::operator<<(os,(string *)&indent7_abi_cxx11_);
  pOVar1 = this->vrr_algo_;
  QAM::QAM((QAM *)local_f0,am);
  iVar2 = OSTEI_VRR_Algorithm_Base::GetMReq(pOVar1,(QAM *)local_f0);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2 + 1);
  std::operator<<(poVar3,");\n");
  std::__cxx11::string::~string((string *)(local_f0 + 0x10));
  poVar3 = std::operator<<((ostream *)&std::cout,"SIMINT EXTERNAL VRR ");
  RRStepTypeToStr_abi_cxx11_((string *)&local_138,step);
  poVar3 = std::operator<<(poVar3,(string *)&local_138);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(am->qam)._M_elems[0]);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(am->qam)._M_elems[1]);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(am->qam)._M_elems[2]);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(am->qam)._M_elems[3]);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&local_138);
  return;
}

Assistant:

void OSTEI_VRR_Writer::WriteVRR_External_(std::ostream & os, QAM am) const
{

    // iterate over increasing am
    RRStepType rrstep = vrr_algo_.GetRRStep(am);

    os << indent5 << "VRR_" << RRStepTypeToStr(rrstep) << "_" 
                  << amchar[am[0]] << "_" << amchar[am[1]] << "_"
                  << amchar[am[2]] << "_" << amchar[am[3]]  << "(\n";

    os << indent7 << PrimVarName(am) << ",\n";

    for(const auto & it : vrr_algo_.GetAMReq(am))
        os << indent7 << PrimVarName(it) << ",\n";
    
    for(const auto & it : vrr_algo_.GetVarReq(am))
        os << indent7 << it << ",\n";

    os << indent7 << (vrr_algo_.GetMReq(am)+1) << ");\n";

    // Mark this as required in the log file
    std::cout << "SIMINT EXTERNAL VRR " << RRStepTypeToStr(rrstep)
              << " " << am[0] << " " << am[1] << " " << am[2] << " " << am[3] << "\n";
}